

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_time.c
# Opt level: O3

int pt_tcal_header_cbr(pt_time_cal *tcal,pt_packet_cbr *packet,pt_config *config)

{
  ulong uVar1;
  int iVar2;
  
  iVar2 = -1;
  if (config != (pt_config *)0x0 && (packet != (pt_packet_cbr *)0x0 && tcal != (pt_time_cal *)0x0))
  {
    if (config->nom_freq == 0) {
      iVar2 = 0;
    }
    else if (packet->ratio == 0) {
      iVar2 = -5;
    }
    else {
      uVar1 = (ulong)(ushort)((ushort)((ushort)config->nom_freq << 8) / (ushort)packet->ratio);
      tcal->fcr = uVar1;
      if (uVar1 < tcal->min_fcr) {
        tcal->min_fcr = uVar1;
      }
      iVar2 = 0;
      if (tcal->max_fcr < uVar1) {
        tcal->max_fcr = uVar1;
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int pt_tcal_header_cbr(struct pt_time_cal *tcal,
		      const struct pt_packet_cbr *packet,
		      const struct pt_config *config)
{
	uint64_t cbr, p1, fcr;

	if (!tcal || !packet || !config)
		return -pte_internal;

	p1 = config->nom_freq;
	if (!p1)
		return 0;

	/* If we know the nominal frequency, we can use it for calibration. */
	cbr = packet->ratio;
	if (!cbr)
		return -pte_bad_packet;

	fcr = (p1 << pt_tcal_fcr_shr) / cbr;

	return pt_tcal_set_fcr(tcal, fcr);
}